

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void join(level *lev,int a,int b,boolean nxcor)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  char cVar5;
  undefined7 in_register_00000009;
  char cVar6;
  undefined8 unaff_RBP;
  ulong uVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  int y;
  mkroom *pmVar11;
  char cVar12;
  mkroom *croom;
  ulong uVar13;
  coord tt;
  coord cc;
  coord dest;
  coord org;
  coord local_84;
  coord local_82;
  uint local_80;
  undefined4 local_7c;
  uint local_78;
  uint local_74;
  undefined8 local_70;
  undefined8 local_68;
  long local_60;
  mkroom *local_58;
  coord local_4c;
  coord local_4a;
  mkroom *local_48;
  long local_40;
  mkroom *local_38;
  undefined8 uStack_8;
  
  uVar13 = (ulong)(uint)b;
  uVar7 = CONCAT71(in_register_00000009,nxcor);
  uStack_8 = unaff_RBP;
  while( true ) {
    local_78 = (uint)uVar13;
    if (a == local_78) {
      return;
    }
    lVar8 = (long)(int)local_78;
    cVar2 = lev->rooms[lVar8].hx;
    if (cVar2 < '\0') {
      return;
    }
    local_60 = (long)a;
    local_38 = lev->rooms + local_60;
    cVar1 = lev->rooms[local_60].hx;
    if (cVar1 < '\0') {
      return;
    }
    if (0x77 < lev->doorindex) {
      return;
    }
    pmVar11 = lev->rooms + lVar8;
    cVar10 = pmVar11->lx;
    local_7c = (undefined4)uVar7;
    local_40 = lVar8;
    if (cVar1 < cVar10) {
      cVar1 = cVar1 + '\x01';
      cVar10 = cVar10 + -1;
      local_68 = 0;
      uVar7 = 0;
      if (cVar1 == cVar10) {
        if (lev->rooms[local_60].ly == lev->rooms[lVar8].ly) {
          uVar7 = (ulong)(lev->rooms[local_60].hy == lev->rooms[lVar8].hy);
        }
        else {
          uVar7 = 0;
        }
      }
      finddpos(lev,&local_82,cVar1,lev->rooms[local_60].ly,cVar1,lev->rooms[local_60].hy);
      finddpos(lev,&local_84,cVar10,lev->rooms[lVar8].ly,cVar10,lev->rooms[lVar8].hy);
      local_70 = 1;
    }
    else {
      cVar12 = lev->rooms[lVar8].hy;
      cVar5 = lev->rooms[local_60].ly;
      if (cVar12 < cVar5) {
        cVar5 = cVar5 + -1;
        cVar12 = cVar12 + '\x01';
        local_70 = 0;
        local_80 = 0;
        if (cVar5 == cVar12) {
          if (local_38->lx == cVar10) {
            local_80 = (uint)CONCAT71((int7)(uVar13 >> 8),cVar1 == cVar2);
          }
          else {
            local_80 = 0;
          }
        }
        finddpos(lev,&local_82,local_38->lx,cVar5,cVar1,cVar5);
        finddpos(lev,&local_84,pmVar11->lx,cVar12,lev->rooms[lVar8].hx,cVar12);
        local_68 = 0xffffffff;
        uVar7 = (ulong)local_80;
      }
      else {
        cVar6 = local_38->lx;
        if (cVar2 < cVar6) {
          cVar6 = cVar6 + -1;
          cVar2 = cVar2 + '\x01';
          local_68 = 0;
          uVar7 = 0;
          if (cVar6 == cVar2) {
            if (cVar5 == lev->rooms[lVar8].ly) {
              uVar7 = (ulong)(lev->rooms[local_60].hy == cVar12);
            }
            else {
              uVar7 = 0;
            }
          }
          finddpos(lev,&local_82,cVar6,cVar5,cVar6,lev->rooms[local_60].hy);
          finddpos(lev,&local_84,cVar2,lev->rooms[lVar8].ly,cVar2,lev->rooms[lVar8].hy);
          local_70 = 0xffffffff;
        }
        else {
          cVar12 = lev->rooms[local_60].hy + '\x01';
          cVar5 = lev->rooms[lVar8].ly + -1;
          uVar7 = CONCAT71((int7)((ulong)uStack_8 >> 8),
                           cVar2 == cVar1 && (cVar10 == cVar6 && cVar12 == cVar5));
          finddpos(lev,&local_82,cVar6,cVar12,cVar1,cVar12);
          finddpos(lev,&local_84,pmVar11->lx,cVar5,lev->rooms[lVar8].hx,cVar5);
          local_68 = 1;
          local_70 = 0;
        }
      }
    }
    local_48 = pmVar11;
    if ((char)uVar7 != '\0') break;
    local_58 = lev->rooms;
    local_80 = (uint)uVar7;
    local_74 = a;
    if (lev->nroom < 1) {
      pmVar11 = (mkroom *)0x0;
    }
    else {
      cVar2 = local_82.x + (char)local_70;
      cVar1 = local_82.y + (char)local_68;
      iVar9 = 0;
      pmVar11 = local_58;
      do {
        bVar3 = inside_room(pmVar11,cVar2,cVar1);
        if (bVar3 != '\0') goto LAB_001d6c11;
        pmVar11 = pmVar11 + 1;
        iVar9 = iVar9 + 1;
      } while (iVar9 < lev->nroom);
      pmVar11 = (mkroom *)0x0;
LAB_001d6c11:
      uVar7 = (ulong)local_80;
    }
    if (lev->nroom < 1) {
      croom = (mkroom *)0x0;
    }
    else {
      cVar2 = local_84.x - (char)local_70;
      cVar1 = local_84.y - (char)local_68;
      iVar9 = 0;
      croom = local_58;
      do {
        bVar3 = inside_room(croom,cVar2,cVar1);
        if (bVar3 != '\0') goto LAB_001d6d1f;
        croom = croom + 1;
        iVar9 = iVar9 + 1;
      } while (iVar9 < lev->nroom);
      croom = (mkroom *)0x0;
LAB_001d6d1f:
      uVar7 = (ulong)local_80;
    }
    if ((pmVar11 == (mkroom *)0x0) ||
       (lVar8 = ((long)pmVar11 - (long)local_58 >> 3) * -0x7b425ed097b425ed, lVar8 - local_40 == 0))
    {
      if ((croom == (mkroom *)0x0) ||
         (uVar13 = ((long)croom - (long)local_58 >> 3) * -0x7b425ed097b425ed, uVar13 - local_60 == 0
         )) break;
      uVar13 = uVar13 & 0xffffffff;
      a = local_74;
    }
    else {
      a = (int)lVar8;
      uVar13 = (ulong)local_78;
    }
    uVar7 = (ulong)(uint)(int)(char)local_7c;
  }
  lVar8 = local_40;
  iVar9 = (int)local_82.x;
  y = (int)local_82.y;
  local_78 = (uint)local_84.x;
  if ((((char)local_7c != '\0') && ((char)uVar7 == '\0')) &&
     (lev->locations[(int)local_70 + iVar9][(int)local_68 + y].typ != '\0')) {
    return;
  }
  iVar4 = okdoor(lev,local_82.x,local_82.y);
  cVar2 = (char)local_7c;
  if ((cVar2 == '\0') || (iVar4 != 0)) {
    dodoor(lev,iVar9,y,local_38);
    cVar2 = (char)local_7c;
  }
  if ((char)uVar7 == '\0') {
    local_4c.x = (char)local_78 - (char)local_70;
    local_4c.y = local_84.y - (char)local_68;
    local_4a.x = local_82.x + (char)local_70;
    local_4a.y = local_82.y + (char)local_68;
    bVar3 = dig_corridor(lev,&local_4a,&local_4c,cVar2,
                         ((*(uint *)&(lev->flags).field_0x8 >> 0x14 & 1) != 0) + '\x18','\0');
    if (bVar3 == '\0') {
      if (cVar2 != '\0') {
        return;
      }
      warning("failed to dig required corridor");
      return;
    }
    iVar9 = okdoor(lev,(xchar)local_78,local_84.y);
    if ((cVar2 == '\0') || (iVar9 != 0)) {
      dodoor(lev,local_78,(int)local_84.y,local_48);
    }
  }
  else {
    add_door(lev,iVar9,y,local_48);
  }
  if (smeq[local_60] < smeq[lVar8]) {
    smeq[lVar8] = smeq[local_60];
    return;
  }
  smeq[local_60] = smeq[lVar8];
  return;
}

Assistant:

static void join(struct level *lev, int a, int b, boolean nxcor)
{
	coord cc,tt, org, dest;
	xchar tx, ty, xx, yy;
	struct mkroom *croom, *troom;
	struct mkroom *couter, *touter;
	int dx, dy;
	boolean splithalves;	/* we're joining two halves of a split room */

	if (a == b) return;

	croom = &lev->rooms[a];
	troom = &lev->rooms[b];

	/* find positions cc and tt for doors in croom and troom
	   and direction for a corridor between them */

	if (troom->hx < 0 || croom->hx < 0 || lev->doorindex >= DOORMAX) return;
	if (troom->lx > croom->hx) {
		/* t is right of c */
		dx =  1;
		dy =  0;
		xx = croom->hx+1;
		tx = troom->lx-1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else if (troom->hy < croom->ly) {
		/* t is above c */
		dx =  0;
		dy = -1;
		yy = croom->ly-1;
		ty = troom->hy+1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	} else if (troom->hx < croom->lx) {
		/* t is left of c */
		dx = -1;
		dy =  0;
		xx = croom->lx-1;
		tx = troom->hx+1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else {
		/* t should be below c */
		dx =  0;
		dy =  1;
		yy = croom->hy+1;
		ty = troom->ly-1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	}

	if (!splithalves) {
	    /* two halves of a split room should be connected, so if another
	       room (itself split or otherwise) tries to connect to one of the
	       halves via its unreachable middle wall, proxy the join to the
	       other half, which should be positioned better for the join */
	    couter = pos_to_room(lev, cc.x+dx, cc.y+dy);
	    touter = pos_to_room(lev, tt.x-dx, tt.y-dy);
	    if (couter && couter - lev->rooms != b) {
		    join(lev, couter - lev->rooms, b, nxcor);
		    return;
	    }
	    if (touter && touter - lev->rooms != a) {
		    join(lev, a, touter - lev->rooms, nxcor );
		    return;
	    }
	}

	xx = cc.x;
	yy = cc.y;
	tx = tt.x - dx;
	ty = tt.y - dy;
	if (nxcor && lev->locations[xx+dx][yy+dy].typ && !splithalves)
		return;
	if (okdoor(lev, xx, yy) || !nxcor)
		dodoor(lev, xx, yy, croom);

	if (splithalves) {
		/* common door already made, so just do bookkeeping */
		add_door(lev, xx, yy, troom);
	} else {
		org.x  = xx+dx;
		org.y  = yy+dy;
		dest.x = tx;
		dest.y = ty;

		if (!dig_corridor(lev, &org, &dest, nxcor,
				  lev->flags.arboreal ? ROOM : CORR, STONE)) {
			if (!nxcor)
				warning("failed to dig required corridor");
			return;
		}

		/* we succeeded in digging the corridor */
		if (okdoor(lev, tt.x, tt.y) || !nxcor)
			dodoor(lev, tt.x, tt.y, troom);
	}

	if (smeq[a] < smeq[b])
		smeq[b] = smeq[a];
	else
		smeq[a] = smeq[b];
}